

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr.c
# Opt level: O0

int rtr_start(rtr_socket *rtr_socket)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  int rtval;
  rtr_socket *rtr_socket_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (rtr_socket->thread_id == 0) {
    iVar2 = pthread_create(&rtr_socket->thread_id,(pthread_attr_t *)0x0,rtr_fsm_start,rtr_socket);
    if (iVar2 == 0) {
      rtr_socket_local._4_4_ = 0;
    }
    else {
      rtr_socket_local._4_4_ = -1;
    }
  }
  else {
    rtr_socket_local._4_4_ = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return rtr_socket_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_start(struct rtr_socket *rtr_socket)
{
	if (rtr_socket->thread_id)
		return RTR_ERROR;

	int rtval = pthread_create(&(rtr_socket->thread_id), NULL, (void *(*)(void *)) & rtr_fsm_start, rtr_socket);

	if (rtval == 0)
		return RTR_SUCCESS;
	return RTR_ERROR;
}